

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O0

int main(void)

{
  char *pcVar1;
  char *local_248;
  char *local_240;
  anon_class_8_1_6b262081 local_238;
  MessageHandle local_230;
  anon_class_1_0_00000001 local_209;
  StreamHandle local_208;
  anon_class_1_0_00000001 local_1d1;
  StreamHandle local_1d0;
  undefined1 local_1b0 [8];
  TCPServer server;
  int port;
  
  server.discHandle_._M_invoker._4_4_ = 0;
  server.discHandle_._M_invoker._0_4_ = 6000;
  pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/examples/echo_server.cpp"
                   ,0x2f);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/examples/echo_server.cpp"
                     ,0x5c);
    if (pcVar1 == (char *)0x0) {
      local_248 = 
      "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/examples/echo_server.cpp"
      ;
    }
    else {
      local_248 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/examples/echo_server.cpp"
                          ,0x5c);
      local_248 = local_248 + 1;
    }
    local_240 = local_248;
  }
  else {
    local_240 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/examples/echo_server.cpp"
                        ,0x2f);
    local_240 = local_240 + 1;
  }
  printf("%s: echo server port:%d\n",local_240,6000);
  SocketPP::TCPServer::TCPServer((TCPServer *)local_1b0,6000);
  std::function<void(SocketPP::TCPStream_const&)>::function<main::__0,void>
            ((function<void(SocketPP::TCPStream_const&)> *)&local_1d0,&local_1d1);
  SocketPP::TCPServer::setConnHandle((TCPServer *)local_1b0,&local_1d0);
  std::function<void_(const_SocketPP::TCPStream_&)>::~function(&local_1d0);
  std::function<void(SocketPP::TCPStream_const&)>::function<main::__1,void>
            ((function<void(SocketPP::TCPStream_const&)> *)&local_208,&local_209);
  SocketPP::TCPServer::setDiscHandle((TCPServer *)local_1b0,&local_208);
  std::function<void_(const_SocketPP::TCPStream_&)>::~function(&local_208);
  local_238.server = (TCPServer *)local_1b0;
  std::function<void(SocketPP::Message_const&)>::function<main::__2,void>
            ((function<void(SocketPP::Message_const&)> *)&local_230,&local_238);
  SocketPP::TCPServer::setRecvHandle((TCPServer *)local_1b0,&local_230);
  std::function<void_(const_SocketPP::Message_&)>::~function(&local_230);
  server.discHandle_._M_invoker._4_4_ = SocketPP::SocketServer::loop((SocketServer *)local_1b0);
  SocketPP::TCPServer::~TCPServer((TCPServer *)local_1b0);
  return server.discHandle_._M_invoker._4_4_;
}

Assistant:

int main() {
    const int port = 6000;
    LOGI("echo server port:%d", port);

    TCPServer server(port);

    server.setConnHandle([] (const TCPStream& stream) {
        LOGI("on connected: fd=%d", stream.fd);
    });

    server.setDiscHandle([] (const TCPStream& stream) {
        LOGI("on disconnected: fd=%d", stream.fd);
    });

    server.setRecvHandle([&] (const Message& message) {
        LOGI("on receive: fd=%d, msg:%s", message.target.fd, message.rawMsg.toString().c_str());
        server.send(message);
    });

    return server.loop();
}